

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

scalar_function_t *
duckdb::UDFWrapper::
CreateScalarFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (string *name,vector<duckdb::LogicalType,_true> *args,LogicalType *ret_type,
          _func_string_t_string_t_string_t_string_t *udf_func)

{
  bool bVar1;
  runtime_error *prVar2;
  size_type sVar3;
  _func_string_t_string_t_string_t_string_t *in_RCX;
  LogicalType *in_RDX;
  vector<duckdb::LogicalType,_true> *in_RSI;
  string *in_RDI;
  size_t num_template_types;
  LogicalType *in_stack_ffffffffffffffc8;
  string *name_00;
  
  name_00 = in_RDI;
  bVar1 = TypesMatch<duckdb::string_t>(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"Return type doesn\'t match with the first template type.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDX);
  if (sVar3 != 3) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,
               "The number of templated types should be the same quantity of the LogicalType arguments."
              );
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CreateTernaryFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
            (name_00,in_RSI,in_RDX,in_RCX);
  return (scalar_function_t *)in_RDI;
}

Assistant:

inline static scalar_function_t CreateScalarFunction(const string &name, const vector<LogicalType> &args,
	                                                     const LogicalType &ret_type, TR (*udf_func)(ARGS...)) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("Return type doesn't match with the first template type.");
		} // LCOV_EXCL_STOP

		const std::size_t num_template_types = sizeof...(ARGS);
		if (num_template_types != args.size()) { // LCOV_EXCL_START
			throw std::runtime_error(
			    "The number of templated types should be the same quantity of the LogicalType arguments.");
		} // LCOV_EXCL_STOP

		switch (num_template_types) {
		case 1:
			return CreateUnaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 2:
			return CreateBinaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 3:
			return CreateTernaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		default: // LCOV_EXCL_START
			throw std::runtime_error("UDF function only supported until ternary!");
		} // LCOV_EXCL_STOP
	}